

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O3

void oonf_logcfg_cleanup(void)

{
  void *__stream;
  
  if ((_stderr_handler._node.next != (list_entity *)0x0) &&
     (_stderr_handler._node.prev != (list_entity *)0x0)) {
    oonf_log_removehandler(&_stderr_handler);
  }
  if ((_syslog_handler._node.next != (list_entity *)0x0) &&
     (_syslog_handler._node.prev != (list_entity *)0x0)) {
    oonf_log_removehandler(&_syslog_handler);
  }
  __stream = _file_handler.custom;
  if ((_file_handler._node.next != (list_entity *)0x0) &&
     (_file_handler._node.prev != (list_entity *)0x0)) {
    fflush((FILE *)_file_handler.custom);
    fclose((FILE *)__stream);
    oonf_log_removehandler(&_file_handler);
    return;
  }
  return;
}

Assistant:

void
oonf_logcfg_cleanup(void) {
  /* clean up former handlers */
  if (list_is_node_added(&_stderr_handler._node)) {
    oonf_log_removehandler(&_stderr_handler);
  }
  if (list_is_node_added(&_syslog_handler._node)) {
    oonf_log_removehandler(&_syslog_handler);
  }
  if (list_is_node_added(&_file_handler._node)) {
    FILE *f;

    f = _file_handler.custom;
    fflush(f);
    fclose(f);

    oonf_log_removehandler(&_file_handler);
  }
}